

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmHexFileConverter.cxx
# Opt level: O0

FileType cmHexFileConverter::DetermineFileType(string *inFileName)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  uint local_434;
  uint i;
  uint slen;
  uint maxLineLength;
  uint minLineLength;
  FileType type;
  FILE *inFile;
  char buf [1024];
  string *inFileName_local;
  
  buf._1016_8_ = inFileName;
  __stream = (FILE *)cmsys::SystemTools::Fopen(inFileName,"rb");
  if (__stream == (FILE *)0x0) {
    inFileName_local._4_4_ = Binary;
  }
  else {
    pcVar3 = fgets((char *)&inFile,0x400,__stream);
    if (pcVar3 == (char *)0x0) {
      inFile._0_1_ = '\0';
    }
    fclose(__stream);
    if ((char)inFile == ':') {
      maxLineLength = 1;
      slen = 0xb;
      i = 0x20b;
    }
    else {
      if ((char)inFile != 'S') {
        return Binary;
      }
      maxLineLength = 2;
      slen = 10;
      i = 0x20e;
    }
    uVar1 = ChompStrlen((char *)&inFile);
    if ((uVar1 < slen) || (i < uVar1)) {
      inFileName_local._4_4_ = Binary;
    }
    else {
      for (local_434 = 1; local_434 < uVar1; local_434 = local_434 + 1) {
        iVar2 = isxdigit((int)buf[(ulong)local_434 - 8]);
        if (iVar2 == 0) {
          return Binary;
        }
      }
      inFileName_local._4_4_ = maxLineLength;
    }
  }
  return inFileName_local._4_4_;
}

Assistant:

cmHexFileConverter::FileType cmHexFileConverter::DetermineFileType(
  const std::string& inFileName)
{
  char buf[1024];
  FILE* inFile = cmsys::SystemTools::Fopen(inFileName, "rb");
  if (inFile == nullptr) {
    return Binary;
  }

  if (!fgets(buf, 1024, inFile)) {
    buf[0] = 0;
  }
  fclose(inFile);
  FileType type = Binary;
  unsigned int minLineLength = 0;
  unsigned int maxLineLength = 0;
  if (buf[0] == ':') // might be an intel hex file
  {
    type = IntelHex;
    minLineLength = INTEL_HEX_MIN_LINE_LENGTH;
    maxLineLength = INTEL_HEX_MAX_LINE_LENGTH;
  } else if (buf[0] == 'S') // might be a motorola srec file
  {
    type = MotorolaSrec;
    minLineLength = MOTOROLA_SREC_MIN_LINE_LENGTH;
    maxLineLength = MOTOROLA_SREC_MAX_LINE_LENGTH;
  } else {
    return Binary;
  }

  unsigned int slen = ChompStrlen(buf);
  if ((slen < minLineLength) || (slen > maxLineLength)) {
    return Binary;
  }

  for (unsigned int i = 1; i < slen; i++) {
    if (!isxdigit(buf[i])) {
      return Binary;
    }
  }
  return type;
}